

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteVerilog.c
# Opt level: O3

int Io_WriteVerilogWiresCount(Abc_Ntk_t *pNtk)

{
  long *plVar1;
  long *plVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  iVar3 = pNtk->nObjCounts[8];
  lVar4 = (long)pNtk->vObjs->nSize;
  if (0 < lVar4) {
    lVar5 = 0;
    do {
      plVar1 = (long *)pNtk->vObjs->pArray[lVar5];
      if ((((plVar1 != (long *)0x0) && (lVar5 != 0)) &&
          ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 7)) &&
         ((plVar1 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                              (long)*(int *)plVar1[6] * 8), *(int *)((long)plVar1 + 0x2c) < 1 ||
          ((*(uint *)(*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                               (long)*(int *)plVar1[6] * 8) + 0x14) & 0xf) - 5 < 0xfffffffe)))) {
        iVar3 = iVar3 + 1;
      }
      lVar5 = lVar5 + 1;
    } while (lVar4 != lVar5);
  }
  lVar4 = (long)pNtk->vBoxes->nSize;
  if (0 < lVar4) {
    lVar5 = 0;
    do {
      plVar1 = (long *)pNtk->vBoxes->pArray[lVar5];
      if ((*(uint *)((long)plVar1 + 0x14) & 0xf) != 8) {
        iVar3 = iVar3 + *(int *)((long)plVar1 + 0x1c);
        if (0 < (long)*(int *)((long)plVar1 + 0x2c)) {
          lVar6 = 0;
          do {
            plVar2 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                               (long)*(int *)(plVar1[6] + lVar6 * 4) * 8);
            plVar2 = *(long **)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                               (long)*(int *)plVar2[6] * 8);
            if ((*(int *)((long)plVar2 + 0x2c) < 1) ||
               ((*(uint *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                    (long)*(int *)plVar2[6] * 8) + 0x14) & 0xf) - 5 < 0xfffffffe)) {
              iVar3 = iVar3 + 1;
            }
            lVar6 = lVar6 + 1;
          } while (*(int *)((long)plVar1 + 0x2c) != lVar6);
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != lVar4);
  }
  return iVar3;
}

Assistant:

int Io_WriteVerilogWiresCount( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pNet, * pBox;
    int i, k, nWires;
    nWires = Abc_NtkLatchNum(pNtk);
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        if ( i == 0 ) 
            continue;
        pNet = Abc_ObjFanout0(pObj);
        if ( Abc_ObjFanoutNum(pNet) > 0 && Abc_ObjIsCo(Abc_ObjFanout0(pNet)) )
            continue;
        nWires++;
    }
    Abc_NtkForEachBox( pNtk, pBox, i )
    {
        if ( Abc_ObjIsLatch(pBox) )
            continue;
        nWires += Abc_ObjFaninNum(pBox);
        Abc_ObjForEachFanout( pBox, pObj, k )
        {
            pNet = Abc_ObjFanout0(pObj);
            if ( Abc_ObjFanoutNum(pNet) > 0 && Abc_ObjIsCo(Abc_ObjFanout0(pNet)) )
                continue;
            nWires++;
        }
    }
    return nWires;
}